

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddLinkDirectory(cmMakefile *this,string *directory,bool before)

{
  cmStateDirectory local_90;
  cmStateDirectory local_58;
  undefined1 local_30 [8];
  cmListFileBacktrace lfbt;
  bool before_local;
  string *directory_local;
  cmMakefile *this_local;
  
  lfbt.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = before;
  GetBacktrace((cmMakefile *)local_30);
  if ((lfbt.TopEntry.
       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi._7_1_ & 1) == 0) {
    cmStateSnapshot::GetDirectory(&local_90,&this->StateSnapshot);
    cmStateDirectory::AppendLinkDirectoriesEntry
              (&local_90,directory,(cmListFileBacktrace *)local_30);
  }
  else {
    cmStateSnapshot::GetDirectory(&local_58,&this->StateSnapshot);
    cmStateDirectory::PrependLinkDirectoriesEntry
              (&local_58,directory,(cmListFileBacktrace *)local_30);
  }
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_30);
  return;
}

Assistant:

void cmMakefile::AddLinkDirectory(std::string const& directory, bool before)
{
  cmListFileBacktrace lfbt = this->GetBacktrace();
  if (before) {
    this->StateSnapshot.GetDirectory().PrependLinkDirectoriesEntry(directory,
                                                                   lfbt);
  } else {
    this->StateSnapshot.GetDirectory().AppendLinkDirectoriesEntry(directory,
                                                                  lfbt);
  }
}